

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O1

void Gia_ManFxTopoOrder_rec
               (Vec_Wec_t *vCubes,Vec_Int_t *vFirst,Vec_Int_t *vCount,Vec_Int_t *vVisit,
               Vec_Int_t *vOrder,int iObj)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  uint iObj_00;
  long lVar6;
  
  if ((((-1 < iObj) && (iObj < vFirst->nSize)) && (iObj < vCount->nSize)) && (iObj < vVisit->nSize))
  {
    if (vVisit->pArray[(uint)iObj] != 0) {
      __assert_fail("!Vec_IntEntry( vVisit, iObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                    ,0x106,
                    "void Gia_ManFxTopoOrder_rec(Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    uVar2 = vFirst->pArray[(uint)iObj];
    uVar3 = vCount->pArray[(uint)iObj];
    vVisit->pArray[(uint)iObj] = 1;
    if (0 < (int)uVar3) {
      uVar5 = 0;
      do {
        if (((int)uVar2 < 0) || (lVar1 = uVar5 + uVar2, vCubes->nSize <= (int)lVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar4 = vCubes->pArray;
        if (pVVar4[lVar1].nSize < 1) goto LAB_006ad7c9;
        if (*pVVar4[lVar1].pArray != iObj) {
          __assert_fail("Vec_IntEntry(vCube, 0) == iObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                        ,0x10b,
                        "void Gia_ManFxTopoOrder_rec(Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        if (1 < pVVar4[lVar1].nSize) {
          lVar6 = 1;
          do {
            if (pVVar4[lVar1].pArray[lVar6] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10c,"int Abc_Lit2Var(int)");
            }
            iObj_00 = (uint)pVVar4[lVar1].pArray[lVar6] >> 1;
            if (vVisit->nSize <= (int)iObj_00) goto LAB_006ad7c9;
            if (vVisit->pArray[iObj_00] == 0) {
              Gia_ManFxTopoOrder_rec(vCubes,vFirst,vCount,vVisit,vOrder,iObj_00);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < pVVar4[lVar1].nSize);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar3);
    }
    Vec_IntPush(vOrder,iObj);
    return;
  }
LAB_006ad7c9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManFxTopoOrder_rec( Vec_Wec_t * vCubes, Vec_Int_t * vFirst, Vec_Int_t * vCount, Vec_Int_t * vVisit, Vec_Int_t * vOrder, int iObj )
{
    int c, v, Lit;
    int iFirst = Vec_IntEntry( vFirst, iObj );
    int nCubes = Vec_IntEntry( vCount, iObj ); 
    assert( !Vec_IntEntry( vVisit, iObj ) );
    Vec_IntWriteEntry( vVisit, iObj, 1 );
    for ( c = 0; c < nCubes; c++ )
    {
        Vec_Int_t * vCube = Vec_WecEntry( vCubes, iFirst + c );
        assert( Vec_IntEntry(vCube, 0) == iObj );
        Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            if ( !Vec_IntEntry( vVisit, Abc_Lit2Var(Lit) ) )
                Gia_ManFxTopoOrder_rec( vCubes, vFirst, vCount, vVisit, vOrder, Abc_Lit2Var(Lit) );
    }
    Vec_IntPush( vOrder, iObj );
}